

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs_file_base.cpp
# Opt level: O2

void __thiscall foxxll::ufs_file_base::close_remove(ufs_file_base *this)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  int in_ESI;
  Logger LStack_188;
  
  close(this,in_ESI);
  if (this->is_device_ == true) {
    tlx::Logger::Logger(&LStack_188);
    std::operator<<((ostream *)&LStack_188,"remove() path=");
    std::operator<<((ostream *)&LStack_188,(string *)&this->filename_);
    std::operator<<((ostream *)&LStack_188," skipped as file is device node");
  }
  else {
    iVar1 = remove((this->filename_)._M_dataplus._M_p);
    if (iVar1 == 0) {
      return;
    }
    tlx::Logger::Logger(&LStack_188);
    std::operator<<((ostream *)&LStack_188,"remove() error on path=");
    std::operator<<((ostream *)&LStack_188,(string *)&this->filename_);
    std::operator<<((ostream *)&LStack_188," error=");
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    std::operator<<((ostream *)&LStack_188,pcVar3);
  }
  tlx::Logger::~Logger(&LStack_188);
  return;
}

Assistant:

void ufs_file_base::close_remove()
{
    close();

    if (is_device_) {
        TLX_LOG1 << "remove() path=" << filename_
                 << " skipped as file is device node";
        return;
    }

    if (::remove(filename_.c_str()) != 0)
        TLX_LOG1 << "remove() error on path=" << filename_
                 << " error=" << strerror(errno);
}